

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::DefaultsTest::testBuffersBindingPoints
          (DefaultsTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_338;
  MessageBuilder local_1a8;
  GLint local_28;
  GLuint local_24;
  GLint buffer_binding;
  GLint i;
  Functions *gl;
  DefaultsTest *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _buffer_binding = CONCAT44(extraout_var,iVar1);
  local_24 = 0;
  while( true ) {
    if (this->m_xfb_indexed_binding_points_count <= (int)local_24) {
      return true;
    }
    local_28 = -1;
    (*this->m_gl_getTransformFeedbacki_v)(this->m_xfb_dsa,0x8c8f,local_24,&local_28);
    err = (**(code **)(_buffer_binding + 0x800))();
    glu::checkError(err,"glGetTransformFeedbacki_v have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x151);
    if (local_28 == -1) break;
    if (local_28 != 0) {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_338,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_338,
                          (char (*) [92])
                          "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has returned "
                         );
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_28);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [25])", however 0 is expected.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_338);
      return false;
    }
    local_24 = local_24 + 1;
  }
  pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  tcu::TestLog::operator<<(&local_1a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_1a8,
                      (char (*) [138])
                      "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has not returned anything and error has not been generated."
                     );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  return false;
}

Assistant:

bool DefaultsTest::testBuffersBindingPoints()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check default binding points value. */
	for (glw::GLint i = 0; i < m_xfb_indexed_binding_points_count; ++i)
	{
		glw::GLint buffer_binding = -1;

		m_gl_getTransformFeedbacki_v(m_xfb_dsa, GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, i, &buffer_binding);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbacki_v have failed");

		if (-1 == buffer_binding)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has not returned "
				   "anything and error has not been generated."
				<< tcu::TestLog::EndMessage;

			return false;
		}
		else
		{
			if (0 != buffer_binding)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has returned "
					<< buffer_binding << ", however 0 is expected." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}